

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

void __thiscall SQVM::Finalize(SQVM *this)

{
  SQUnsignedInteger SVar1;
  SQVM *in_RDI;
  SQInteger i;
  SQInteger size;
  SQObjectPtr *in_stack_ffffffffffffff70;
  CallInfo *fill;
  SQObjectPtr *in_stack_ffffffffffffff78;
  undefined8 *newsize;
  SQUnsignedInteger local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  if (in_RDI->_releasehook != (SQRELEASEHOOK)0x0) {
    (*in_RDI->_releasehook)(in_RDI->_foreignptr,0);
    in_RDI->_releasehook = (SQRELEASEHOOK)0x0;
  }
  if (in_RDI->_openouters != (SQOuter *)0x0) {
    CloseOuters(in_RDI,in_stack_ffffffffffffff78);
  }
  ::SQObjectPtr::Null(in_stack_ffffffffffffff70);
  ::SQObjectPtr::Null(in_stack_ffffffffffffff70);
  ::SQObjectPtr::Null(in_stack_ffffffffffffff70);
  in_RDI->_debughook = false;
  in_RDI->_debughook_native = (SQDEBUGHOOK)0x0;
  ::SQObjectPtr::Null(in_stack_ffffffffffffff70);
  ::SQObjectPtr::Null(in_stack_ffffffffffffff70);
  fill = (CallInfo *)&in_RDI->_callstackdata;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_18 = 0;
  newsize = &local_58;
  CallInfo::CallInfo((CallInfo *)0x133ff9);
  sqvector<SQVM::CallInfo>::resize
            ((sqvector<SQVM::CallInfo> *)in_RDI,(SQUnsignedInteger)newsize,fill);
  CallInfo::~CallInfo((CallInfo *)0x134018);
  SVar1 = sqvector<SQObjectPtr>::size(&in_RDI->_stack);
  for (local_78 = 0; (long)local_78 < (long)SVar1; local_78 = local_78 + 1) {
    sqvector<SQObjectPtr>::operator[](&in_RDI->_stack,local_78);
    ::SQObjectPtr::Null((SQObjectPtr *)fill);
  }
  return;
}

Assistant:

void SQVM::Finalize()
{
    if(_releasehook) { _releasehook(_foreignptr,0); _releasehook = NULL; }
    if(_openouters) CloseOuters(&_stack._vals[0]);
    _roottable.Null();
    _lasterror.Null();
    _errorhandler.Null();
    _debughook = false;
    _debughook_native = NULL;
    _debughook_closure.Null();
    temp_reg.Null();
    _callstackdata.resize(0);
    SQInteger size=_stack.size();
    for(SQInteger i=0;i<size;i++)
        _stack[i].Null();
}